

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)59,(moira::Mode)4,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  
  pcVar4 = "eor";
  if (str->upper != false) {
    pcVar4 = "EOR";
  }
  cVar5 = *pcVar4;
  while (cVar5 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar5;
    cVar5 = *pcVar4;
  }
  if (str->upper == false) {
    cVar5 = '.';
    lVar6 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = ".l"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  else {
    cVar5 = '.';
    lVar6 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = ".L"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar1) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = 'D';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  cVar5 = ',';
  lVar6 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar5;
    cVar5 = "), "[lVar6 + 2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  cVar5 = '-';
  lVar6 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar5;
    cVar5 = "-("[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ')';
  return;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    *this << (upper ? instrUpper[I] : instrLower[I]);
    return *this;
}